

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testselectionwidget.cpp
# Opt level: O3

bool should_do_animation_proc(Am_Object *param_1)

{
  bool bVar1;
  Am_Value *this;
  
  this = (Am_Value *)Am_Object::Get(0x6730,0x169);
  bVar1 = Am_Value::operator_cast_to_bool(this);
  return bVar1;
}

Assistant:

Am_Define_No_Self_Formula(bool, should_do_animation)
{
  bool anim_on = animations_command.Get(Am_VALUE);
  //only if this is a top-level object
  if (anim_on)
    return true; // && self.Get_Owner() == created_objs)
  else
    return false;
}